

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void __thiscall
ncnn::Mat::to_pixels_resize
          (Mat *this,uchar *pixels,int type,int target_width,int target_height,int target_stride)

{
  int in_ECX;
  uint in_EDX;
  long in_RDI;
  int in_R8D;
  int unaff_retaddr;
  int in_stack_00000008;
  Mat src_2;
  Mat src_1;
  Mat src;
  int type_to;
  int in_stack_fffffffffffffcf4;
  uchar *in_stack_fffffffffffffcf8;
  Mat *in_stack_fffffffffffffd00;
  undefined8 in_stack_fffffffffffffd08;
  int iVar2;
  void **ppvVar1;
  size_t in_stack_fffffffffffffd10;
  undefined8 in_stack_fffffffffffffd18;
  Mat *in_stack_fffffffffffffd20;
  uint local_284;
  void *local_278;
  int *local_270;
  undefined8 local_268;
  undefined4 local_260;
  long *local_258;
  undefined4 local_250;
  undefined4 local_24c;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined8 local_238;
  void *local_230;
  int *local_228;
  undefined8 local_220;
  undefined4 local_218;
  long *local_210;
  undefined4 local_208;
  undefined4 local_204;
  undefined4 local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined8 local_1f0;
  void *local_1d8;
  int *local_1d0;
  undefined8 local_1c8;
  undefined4 local_1c0;
  long *local_1b8;
  undefined4 local_1b0;
  undefined4 local_1ac;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined8 local_198;
  uint local_18c;
  void **local_168;
  void **local_158;
  void **local_148;
  undefined8 local_138;
  undefined4 local_12c;
  undefined8 local_128;
  undefined4 local_120;
  undefined4 local_11c;
  void **local_118;
  undefined8 local_110;
  undefined4 local_104;
  undefined8 local_100;
  undefined4 local_f8;
  int in_stack_ffffffffffffff0c;
  int w;
  uchar *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  int iVar3;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  int iVar4;
  uchar *in_stack_ffffffffffffff28;
  uchar *src_00;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  iVar2 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20);
  if ((*(int *)(in_RDI + 0x2c) == in_ECX) && (*(int *)(in_RDI + 0x30) == in_R8D)) {
    to_pixels(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4);
  }
  else {
    if ((in_EDX & 0xffff0000) == 0) {
      local_284 = in_EDX & 0xffff;
    }
    else {
      local_284 = (int)in_EDX >> 0x10;
    }
    local_18c = local_284;
    iVar4 = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
    if ((local_284 == 1) || (local_284 == 2)) {
      local_11c = *(undefined4 *)(in_RDI + 0x2c);
      local_120 = *(undefined4 *)(in_RDI + 0x30);
      local_118 = &local_1d8;
      local_128 = 3;
      local_12c = 3;
      local_138 = 0;
      local_1d8 = (void *)0x0;
      local_1d0 = (int *)0x0;
      local_1c8 = 0;
      local_1c0 = 0;
      local_1b8 = (long *)0x0;
      local_1b0 = 0;
      local_1ac = 0;
      local_1a8 = 0;
      local_1a4 = 0;
      local_1a0 = 0;
      local_198 = 0;
      create(in_stack_fffffffffffffd20,iVar4,(int)in_stack_fffffffffffffd18,
             in_stack_fffffffffffffd10,iVar2,(Allocator *)in_stack_fffffffffffffd00);
      to_pixels(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4);
      resize_bilinear_c3(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                         in_stack_ffffffffffffff20,iVar3,in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff0c,unaff_retaddr,in_stack_00000008);
      local_168 = &local_1d8;
      if (local_1d0 != (int *)0x0) {
        LOCK();
        iVar2 = *local_1d0;
        *local_1d0 = *local_1d0 + -1;
        UNLOCK();
        if (iVar2 == 1) {
          if (local_1b8 == (long *)0x0) {
            if (local_1d8 != (void *)0x0) {
              free(local_1d8);
            }
          }
          else {
            (**(code **)(*local_1b8 + 0x18))(local_1b8,local_1d8);
          }
        }
      }
    }
    else if (local_284 == 3) {
      w = *(int *)(in_RDI + 0x2c);
      local_f8 = *(undefined4 *)(in_RDI + 0x30);
      ppvVar1 = &local_230;
      local_100 = 1;
      local_104 = 1;
      local_110 = 0;
      local_230 = (void *)0x0;
      local_228 = (int *)0x0;
      local_220 = 0;
      local_218 = 0;
      local_210 = (long *)0x0;
      local_208 = 0;
      local_204 = 0;
      local_200 = 0;
      local_1fc = 0;
      local_1f8 = 0;
      local_1f0 = 0;
      create(in_stack_fffffffffffffd20,iVar4,(int)in_stack_fffffffffffffd18,
             in_stack_fffffffffffffd10,iVar2,(Allocator *)in_stack_fffffffffffffd00);
      to_pixels(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4);
      resize_bilinear_c1(in_stack_ffffffffffffff28,in_stack_ffffffffffffff24,
                         in_stack_ffffffffffffff20,iVar3,(uchar *)ppvVar1,w,unaff_retaddr,
                         in_stack_00000008);
      local_158 = &local_230;
      if (local_228 != (int *)0x0) {
        LOCK();
        iVar2 = *local_228;
        *local_228 = *local_228 + -1;
        UNLOCK();
        if (iVar2 == 1) {
          if (local_210 == (long *)0x0) {
            if (local_230 != (void *)0x0) {
              free(local_230);
            }
          }
          else {
            (**(code **)(*local_210 + 0x18))(local_210,local_230);
          }
        }
      }
    }
    else if ((local_284 == 4) || (local_284 == 5)) {
      src_00 = (uchar *)0x4;
      iVar4 = 4;
      iVar3 = 0;
      local_278 = (void *)0x0;
      local_270 = (int *)0x0;
      local_268 = 0;
      local_260 = 0;
      local_258 = (long *)0x0;
      local_250 = 0;
      local_24c = 0;
      local_248 = 0;
      local_244 = 0;
      local_240 = 0;
      local_238 = 0;
      create(in_stack_fffffffffffffd20,(int)((ulong)&local_278 >> 0x20),(int)&local_278,
             in_stack_fffffffffffffd10,iVar2,(Allocator *)in_stack_fffffffffffffd00);
      to_pixels(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf4);
      resize_bilinear_c4(src_00,iVar4,in_stack_ffffffffffffff20,iVar3,in_stack_ffffffffffffff10,
                         in_stack_ffffffffffffff0c,unaff_retaddr,in_stack_00000008);
      ppvVar1 = &local_278;
      if (local_270 != (int *)0x0) {
        LOCK();
        iVar2 = *local_270;
        *local_270 = *local_270 + -1;
        UNLOCK();
        if (iVar2 == 1) {
          local_148 = ppvVar1;
          if (local_258 == (long *)0x0) {
            if (local_278 != (void *)0x0) {
              free(local_278);
            }
          }
          else {
            (**(code **)(*local_258 + 0x18))(local_258,local_278);
          }
        }
      }
      *ppvVar1 = (void *)0x0;
      ppvVar1[2] = (void *)0x0;
      *(undefined4 *)(ppvVar1 + 3) = 0;
      *(undefined4 *)(ppvVar1 + 5) = 0;
      *(undefined4 *)((long)ppvVar1 + 0x2c) = 0;
      *(undefined4 *)(ppvVar1 + 6) = 0;
      *(undefined4 *)((long)ppvVar1 + 0x34) = 0;
      *(undefined4 *)(ppvVar1 + 7) = 0;
      ppvVar1[8] = (void *)0x0;
      ppvVar1[1] = (void *)0x0;
    }
  }
  return;
}

Assistant:

void Mat::to_pixels_resize(unsigned char* pixels, int type, int target_width, int target_height, int target_stride) const
{
    if (w == target_width && h == target_height)
        return to_pixels(pixels, type);

    int type_to = (type & PIXEL_CONVERT_MASK) ? (type >> PIXEL_CONVERT_SHIFT) : (type & PIXEL_FORMAT_MASK);

    if (type_to == PIXEL_RGB || type_to == PIXEL_BGR)
    {
        Mat src(w, h, (size_t)3u, 3);

        to_pixels(src, type);

        resize_bilinear_c3(src, w, h, w * 3, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_GRAY)
    {
        Mat src(w, h, (size_t)1u, 1);

        to_pixels(src, type);

        resize_bilinear_c1(src, w, h, w * 1, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_RGBA || type_to == PIXEL_BGRA)
    {
        Mat src(w, h, (size_t)4u, 4);

        to_pixels(src, type);

        resize_bilinear_c4(src, w, h, w * 4, pixels, target_width, target_height, target_stride);
    }
}